

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setAccessibleIdentifier(QWidget *this,QString *identifier)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  code *local_40;
  undefined8 local_38;
  QWidget *pQStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(lVar1 + 0x178);
  if (lVar2 == (identifier->d).size) {
    QVar4.m_data = *(storage_type_conflict **)(lVar1 + 0x170);
    QVar4.m_size = lVar2;
    QVar5.m_data = (identifier->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') goto LAB_0030dd9c;
  }
  QString::operator=((QString *)(lVar1 + 0x168),(QString *)identifier);
  local_40 = QFont::strikeOut;
  local_38 = 0xaaaaaaaa000080e0;
  local_28 = 0xaaaaaaaaffffffff;
  pQStack_30 = this;
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_40);
LAB_0030dd9c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setAccessibleIdentifier(const QString &identifier)
{
    Q_D(QWidget);
    if (d->accessibleIdentifier == identifier)
        return;

    d->accessibleIdentifier = identifier;
    QAccessibleEvent event(this, QAccessible::IdentifierChanged);
    QAccessible::updateAccessibility(&event);
}